

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

bool __thiscall
libtorrent::aux::anon_unknown_119::last_optimistic_unchoke_cmp::operator()
          (last_optimistic_unchoke_cmp *this,opt_unchoke_candidate *l,opt_unchoke_candidate *r)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint64_t uVar4;
  uint64_t uVar5;
  torrent_peer *pir;
  torrent_peer *pil;
  opt_unchoke_candidate *r_local;
  opt_unchoke_candidate *l_local;
  last_optimistic_unchoke_cmp *this_local;
  
  peVar3 = ::std::
           __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)l->peer);
  iVar1 = (*(peVar3->super_bandwidth_socket)._vptr_bandwidth_socket[7])();
  peVar3 = ::std::
           __shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::aux::peer_connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)r->peer);
  iVar2 = (*(peVar3->super_bandwidth_socket)._vptr_bandwidth_socket[7])();
  if (*(short *)(CONCAT44(extraout_var,iVar1) + 0x14) ==
      *(short *)(CONCAT44(extraout_var_00,iVar2) + 0x14)) {
    uVar4 = get_ext_priority(this,l);
    uVar5 = get_ext_priority(this,r);
    this_local._7_1_ = uVar4 < uVar5;
  }
  else {
    this_local._7_1_ =
         *(ushort *)(CONCAT44(extraout_var,iVar1) + 0x14) <
         *(ushort *)(CONCAT44(extraout_var_00,iVar2) + 0x14);
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(opt_unchoke_candidate const& l
				, opt_unchoke_candidate const& r) const
			{
				torrent_peer const* pil = (*l.peer)->peer_info_struct();
				torrent_peer const* pir = (*r.peer)->peer_info_struct();
				if (pil->last_optimistically_unchoked
					!= pir->last_optimistically_unchoked)
				{
					return pil->last_optimistically_unchoked
						< pir->last_optimistically_unchoked;
				}
				else
				{
					return get_ext_priority(l) < get_ext_priority(r);
				}
			}